

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

sexp sexp_make_null_env_op(sexp ctx,sexp self,sexp_sint_t n,sexp version)

{
  sexp env;
  sexp psVar1;
  long lVar2;
  sexp core;
  sexp e;
  sexp local_50;
  sexp local_48;
  sexp_gc_var_t local_40;
  sexp_gc_var_t local_30;
  
  local_40.var = &local_48;
  local_48 = (sexp)0x43e;
  local_30.var = &local_50;
  local_50 = (sexp)&DAT_0000043e;
  local_30.next = &local_40;
  local_40.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_30;
  local_48 = sexp_alloc_tagged_aux(ctx,0x28,0x17);
  (local_48->value).flonum = 0.0;
  (local_48->value).type.cpl = (sexp)0x0;
  (local_48->value).uvector.length = 0x23e;
  (local_48->value).bytecode.length = 0x23e;
  lVar2 = 0;
  do {
    local_50 = sexp_alloc_tagged_aux(ctx,0x18,0x19);
    env = local_48;
    psVar1 = *(sexp *)((long)&core_forms[0].name + lVar2);
    (local_50->value).flonum = *(double *)(&core_forms[0].code + lVar2);
    (local_50->value).type.cpl = psVar1;
    psVar1 = sexp_intern(ctx,(char *)(local_50->value).type.cpl,-1);
    sexp_env_define(ctx,env,psVar1,local_50);
    psVar1 = sexp_c_string(ctx,(char *)(local_50->value).type.cpl,-1);
    (local_50->value).type.cpl = psVar1;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0xa0);
  (ctx->value).context.saves = local_40.next;
  return local_48;
}

Assistant:

sexp sexp_make_null_env_op (sexp ctx, sexp self, sexp_sint_t n, sexp version) {
  sexp_uint_t i;
  sexp_gc_var2(e, core);
  sexp_gc_preserve2(ctx, e, core);
  e = sexp_make_env(ctx);
  for (i=0; i<(sizeof(core_forms)/sizeof(core_forms[0])); i++) {
    core = sexp_copy_core(ctx, &core_forms[i]);
    sexp_env_define(ctx, e, sexp_intern(ctx, (char*)sexp_core_name(core), -1), core);
    sexp_core_name(core) = sexp_c_string(ctx, (char*)sexp_core_name(core), -1);
  }
  sexp_gc_release2(ctx);
  return e;
}